

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ConcatenationExpression::fromSyntax
          (Compilation *compilation,ConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SymbolKind SVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  ulong uVar3;
  Compilation *compilation_00;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  bitwidth_t bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Expression *pEVar11;
  undefined7 extraout_var;
  undefined7 uVar19;
  reference pvVar12;
  undefined7 extraout_var_00;
  undefined4 extraout_var_02;
  Type *pTVar13;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar14;
  SourceLocation SVar15;
  Type *rhs;
  undefined7 extraout_var_01;
  ConstantRange CVar16;
  Diagnostic *pDVar17;
  undefined4 extraout_var_03;
  ConcatenationExpression *pCVar18;
  int iVar20;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *extraout_RDX_02;
  ASTContext *src;
  ASTContext *extraout_RDX_03;
  ASTContext *extraout_RDX_04;
  ASTContext *extraout_RDX_05;
  ASTContext *extraout_RDX_06;
  ASTContext *extraout_RDX_07;
  ASTContext *extraout_RDX_08;
  ASTContext *extraout_RDX_09;
  size_t extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  EVP_PKEY_CTX *extraout_RDX_17;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX_18;
  size_t extraout_RDX_19;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  SourceRange SVar24;
  Expression *arg;
  Expression *arg_1;
  SmallVector<slang::ast::Expression_*,_5UL> buffer;
  bitmask<slang::ast::AssignFlags> *in_stack_ffffffffffffff10;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_e8;
  ConcatenationExpressionSyntax *local_d0;
  Type *local_c8;
  Type *local_c0;
  ulong local_b8;
  Type *local_b0;
  Compilation *local_a8;
  SourceRange local_a0;
  ulong local_90;
  SmallVectorBase<slang::ast::Expression_*> local_88 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  src = context;
  local_d0 = syntax;
  local_a8 = compilation;
  if ((assignmentTarget == (Type *)0x0) ||
     (bVar4 = Type::isUnpackedArray(assignmentTarget), src = extraout_RDX, !bVar4)) {
    local_88[0].data_ = (pointer)local_88[0].firstElement;
    local_88[0].len = 0;
    local_88[0].cap = 5;
    uVar23 = (local_d0->expressions).elements._M_extent._M_extent_value + 1;
    uVar21 = local_b8 >> 0x20;
    local_b8 = uVar21 << 0x20;
    uVar3 = (ulong)local_c0 >> 0x20;
    local_c0 = (Type *)(uVar3 << 0x20);
    bVar7 = 0;
    uVar8 = 0;
    if (1 < uVar23) {
      uVar23 = uVar23 >> 1;
      lVar22 = 0;
      local_c8 = (Type *)((ulong)local_c8 & 0xffffffff00000000);
      local_90 = 0;
      local_c0 = (Type *)(uVar3 << 0x20);
      local_b0 = (Type *)((ulong)local_b0 & 0xffffffff00000000);
      local_b8 = uVar21 << 0x20;
      do {
        ppSVar14 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&(((local_d0->expressions).elements._M_ptr)->
                                      super_ConstTokenOrSyntax).
                                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                              + lVar22));
        pSVar2 = *ppSVar14;
        extraFlags.m_bits._1_7_ = 0;
        extraFlags.m_bits._0_1_ =
             ((SyntaxNode *)&pSVar2->kind)->kind == MultipleConcatenationExpression;
        SVar15 = (SourceLocation)
                 Expression::create(compilation,(ExpressionSyntax *)pSVar2,context,extraFlags,
                                    (Type *)0x0);
        local_a0.startLoc = SVar15;
        SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                  ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_a0);
        bVar4 = Expression::bad((Expression *)local_a0.startLoc);
        iVar10 = 4;
        src = extraout_RDX_00;
        uVar19 = extraout_var;
        if (bVar4) {
LAB_004e1cc4:
          local_c8 = (Type *)CONCAT44(local_c8._4_4_,(int)CONCAT71(uVar19,1));
        }
        else {
          pTVar13 = *(Type **)((long)local_a0.startLoc + 8);
          if (pTVar13->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar13);
            src = extraout_RDX_01;
          }
          if (((pTVar13->canonical->super_Symbol).kind == VoidType) &&
             (((SyntaxNode *)&pSVar2->kind)->kind == MultipleConcatenationExpression)) {
            iVar10 = 5;
          }
          else if ((pTVar13->canonical->super_Symbol).kind == StringType) {
            iVar10 = 5;
            local_c0 = (Type *)CONCAT44(local_c0._4_4_,
                                        (int)CONCAT71((int7)((ulong)pTVar13->canonical >> 8),1));
          }
          else {
            bVar4 = Type::isIntegral(pTVar13);
            if (bVar4) {
              bVar4 = Expression::isUnsizedInteger((Expression *)local_a0.startLoc);
              if ((bVar4) && ((local_90 & 1) == 0)) {
                pDVar17 = ASTContext::addDiag(context,(DiagCode)0xd80007,
                                              *(SourceRange *)((long)local_a0.startLoc + 0x20));
                bVar7 = Type::getBitWidth(pTVar13);
                local_e8._M_ptr = (pointer)(ulong)bVar7;
                pvVar12 = std::
                          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                          ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&local_e8);
                local_90 = CONCAT71((int7)((ulong)pvVar12 >> 8),1);
              }
              bVar7 = Type::getBitWidth(pTVar13);
              SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
              bVar7 = (bitwidth_t)local_b0 + bVar7;
              local_b0 = (Type *)CONCAT44(local_b0._4_4_,bVar7);
              bVar4 = ASTContext::requireValidBitWidth(context,bVar7,SVar24);
              src = extraout_RDX_02;
              uVar19 = extraout_var_00;
              if (!bVar4) goto LAB_004e1cc4;
              bVar4 = Type::isFourState(pTVar13);
              src = (ASTContext *)(ulong)(byte)((byte)local_b8 | 2);
              if (!bVar4) {
                src = (ASTContext *)(ulong)((uint)local_b8 & 0xff);
              }
              local_b8 = CONCAT44(local_b8._4_4_,(int)src);
              iVar10 = 0;
            }
            else {
              SVar15 = *(SourceLocation *)((long)local_a0.startLoc + 0x28);
              pDVar17 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                            *(SourceRange *)((long)local_a0.startLoc + 0x20));
              local_c8 = (Type *)CONCAT44(local_c8._4_4_,(int)CONCAT71(SVar15._1_7_,1));
              ast::operator<<(pDVar17,pTVar13);
              src = extraout_RDX_03;
            }
          }
        }
        compilation = local_a8;
        if ((iVar10 != 5) && (iVar10 != 0)) break;
        lVar22 = lVar22 + 0x30;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      bVar7 = (bitwidth_t)local_b0;
      uVar8 = (uint)local_c8;
    }
    if ((uVar8 & 1) == 0) {
      local_b0 = (Type *)CONCAT44(local_b0._4_4_,bVar7);
      if (local_88[0].len != 0) {
        uVar21 = 0;
        do {
          if (((ulong)local_c0 & 1) == 0) {
            Expression::selfDetermined
                      (context,(Expression **)((long)local_88[0].data_ + uVar21 * 8));
            src = extraout_RDX_05;
          }
          else {
            local_e8._M_ptr = *(pointer *)((long)local_88[0].data_ + uVar21 * 8);
            pTVar13 = (Type *)(((Type *)local_e8._M_ptr)->super_Symbol).name._M_len;
            if (pTVar13->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar13);
            }
            if ((pTVar13->canonical->super_Symbol).kind == StringType) {
              Expression::selfDetermined(context,(Expression **)&local_e8);
              src = extraout_RDX_04;
LAB_004e1ef5:
              *(pointer *)((long)local_88[0].data_ + uVar21 * 8) = local_e8._M_ptr;
              bVar4 = true;
            }
            else {
              bVar4 = Expression::isImplicitString((Expression *)local_e8._M_ptr);
              if (bVar4) {
                local_48 = 0;
                uStack_40 = 0;
                local_e8._M_ptr =
                     (pointer)ConversionExpression::makeImplicit
                                        (context,local_a8->stringType,Implicit,
                                         (Expression *)local_e8._M_ptr,(Expression *)0x0,
                                         (SourceRange)ZEXT816(0));
                src = extraout_RDX_06;
                goto LAB_004e1ef5;
              }
              ASTContext::addDiag(context,(DiagCode)0x420007,
                                  *(SourceRange *)&((Symbol *)local_e8._M_ptr)->parentScope);
              uVar8 = 1;
              bVar4 = false;
              src = extraout_RDX_07;
            }
            if (!bVar4) break;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < local_88[0].len);
      }
      compilation = local_a8;
      bVar7 = (bitwidth_t)local_b0;
      if ((bitwidth_t)local_b0 == 0 && ((ulong)local_c0 & 1) == 0) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
        uVar8 = 1;
        ASTContext::addDiag(context,(DiagCode)0x4e0007,SVar24);
        src = extraout_RDX_08;
      }
    }
    if ((uVar8 & 1) == 0) {
      if (((ulong)local_c0 & 1) == 0) {
        pTVar13 = Compilation::getType(compilation,bVar7,local_b8._0_1_);
        src = extraout_RDX_09;
      }
      else {
        pTVar13 = compilation->stringType;
      }
      iVar10 = SmallVectorBase<slang::ast::Expression_*>::copy
                         (local_88,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
      local_e8._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar10);
      local_e8._M_extent._M_extent_value = extraout_RDX_10;
      local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
      pCVar18 = BumpAllocator::
                emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                          (&compilation->super_BumpAllocator,pTVar13,
                           (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           &local_e8,&local_a0);
    }
    else {
      pTVar13 = compilation->errorType;
      local_e8._M_ptr = (pointer)0x0;
      local_e8._M_extent._M_extent_value = 0;
      local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
      pCVar18 = BumpAllocator::
                emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                          (&compilation->super_BumpAllocator,pTVar13,&local_e8,&local_a0);
      pCVar18 = (ConcatenationExpression *)
                Expression::badExpr(compilation,&pCVar18->super_Expression);
    }
    if (local_88[0].data_ == (pointer)local_88[0].firstElement) {
      return &pCVar18->super_Expression;
    }
  }
  else {
    if (assignmentTarget->canonical == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
    }
    if ((assignmentTarget->canonical->super_Symbol).kind == AssociativeArrayType) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
      ASTContext::addDiag(context,(DiagCode)0xa60007,SVar24);
      pEVar11 = Expression::badExpr(compilation,(Expression *)0x0);
      return pEVar11;
    }
    local_b0 = assignmentTarget;
    pTVar13 = Type::getArrayElementType(assignmentTarget);
    src_00 = extraout_RDX_11;
    if (pTVar13->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar13);
      src_00 = extraout_RDX_12;
    }
    SVar1 = (pTVar13->canonical->super_Symbol).kind;
    local_88[0].data_ = (pointer)local_88[0].firstElement;
    local_88[0].len = 0;
    local_88[0].cap = 5;
    uVar21 = (local_d0->expressions).elements._M_extent._M_extent_value + 1;
    if (uVar21 < 2) {
      local_c8 = (Type *)0x0;
      bVar5 = 0;
      bVar4 = false;
    }
    else {
      uVar21 = uVar21 >> 1;
      lVar22 = 0;
      bVar4 = false;
      local_b8 = 0;
      local_c8 = (Type *)0x0;
      local_c0 = pTVar13;
      do {
        ppSVar14 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              ((long)&(((local_d0->expressions).elements._M_ptr)->
                                      super_ConstTokenOrSyntax).
                                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      .
                                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                              + lVar22));
        pSVar2 = *ppSVar14;
        local_e8._M_ptr = (pointer)0x0;
        if (SVar1 == VirtualInterfaceType) {
          local_e8._M_ptr =
               (pointer)Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)pSVar2,false);
        }
        if ((Type *)local_e8._M_ptr == (Type *)0x0) {
          local_e8._M_ptr =
               (pointer)Expression::create(local_a8,(ExpressionSyntax *)pSVar2,context,
                                           (bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0);
        }
        bVar6 = Expression::bad((Expression *)local_e8._M_ptr);
        if (bVar6) {
          bVar4 = true;
          src_00 = extraout_RDX_13;
        }
        else {
          bVar6 = Expression::isImplicitlyAssignableTo
                            ((Expression *)local_e8._M_ptr,local_a8,local_c0);
          if (bVar6) {
            SVar24.endLoc = (SourceLocation)0x0;
            SVar24.startLoc = (SourceLocation)((Symbol *)local_e8._M_ptr)->nextInScope;
            SVar15 = (SourceLocation)
                     Expression::convertAssignment
                               ((Expression *)context,(ASTContext *)local_c0,(Type *)local_e8._M_ptr
                                ,(Expression *)((Symbol *)local_e8._M_ptr)->parentScope,SVar24,
                                (Expression **)0x0,in_stack_ffffffffffffff10);
            local_a0.startLoc = SVar15;
            SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*>
                      ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_a0
                      );
            local_c8 = (Type *)((long)&(local_c8->super_Symbol).kind + 1);
            src_00 = extraout_RDX_14;
          }
          else {
            pTVar13 = (Type *)(((Symbol *)local_e8._M_ptr)->name)._M_len;
            bVar6 = Type::isUnpackedArray(pTVar13);
            if (bVar6) {
              rhs = Type::getArrayElementType(pTVar13);
              bVar6 = Type::isAssignmentCompatible(local_c0,rhs);
              if (bVar6) {
                bVar6 = Type::hasFixedRange(pTVar13);
                if (bVar6) {
                  CVar16 = Type::getFixedRange(pTVar13);
                  iVar9 = CVar16.left;
                  iVar20 = CVar16.right;
                  iVar10 = iVar9 - iVar20;
                  if (iVar9 - iVar20 == 0 || iVar9 < iVar20) {
                    iVar10 = -(iVar9 - iVar20);
                  }
                  local_c8 = (Type *)((long)&(local_c8->super_Symbol).kind + (ulong)(iVar10 + 1));
                }
                else {
                  local_b8 = CONCAT71(extraout_var_01,1);
                }
                Expression::selfDetermined(context,(Expression **)&local_e8);
                SmallVectorBase<slang::ast::Expression*>::
                emplace_back<slang::ast::Expression*const&>
                          ((SmallVectorBase<slang::ast::Expression*> *)local_88,
                           (Expression **)&local_e8);
                src_00 = extraout_RDX_16;
                goto LAB_004e224f;
              }
            }
            pDVar17 = ASTContext::addDiag(context,(DiagCode)0x210007,
                                          *(SourceRange *)&((Symbol *)local_e8._M_ptr)->parentScope)
            ;
            ast::operator<<(pDVar17,pTVar13);
            Expression::selfDetermined(context,(Expression **)&local_e8);
            SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
                      ((SmallVectorBase<slang::ast::Expression*> *)local_88,(Expression **)&local_e8
                      );
            bVar4 = true;
            src_00 = extraout_RDX_15;
          }
        }
LAB_004e224f:
        lVar22 = lVar22 + 0x30;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      bVar5 = (byte)local_b8;
    }
    compilation_00 = local_a8;
    pTVar13 = local_b0;
    if (((bVar5 & 1) == 0 && !bVar4) &&
       (bVar6 = Type::hasFixedRange(local_b0), src_00 = extraout_RDX_17, bVar6)) {
      CVar16 = Type::getFixedRange(pTVar13);
      iVar10 = CVar16.left;
      iVar9 = CVar16.right;
      src_00 = (EVP_PKEY_CTX *)(ulong)(uint)-(iVar10 - iVar9);
      uVar8 = iVar10 - iVar9;
      if (iVar10 - iVar9 == 0 || iVar10 < iVar9) {
        uVar8 = -(iVar10 - iVar9);
      }
      if (local_c8 != (Type *)(ulong)(uVar8 + 1)) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
        pDVar17 = ASTContext::addDiag(context,(DiagCode)0xa70007,SVar24);
        pDVar17 = ast::operator<<(pDVar17,pTVar13);
        CVar16 = Type::getFixedRange(pTVar13);
        iVar9 = CVar16.left;
        iVar20 = CVar16.right;
        iVar10 = iVar9 - iVar20;
        if (iVar9 - iVar20 == 0 || iVar9 < iVar20) {
          iVar10 = -(iVar9 - iVar20);
        }
        local_e8._M_ptr = (pointer)(ulong)(iVar10 + 1);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&local_e8);
        local_e8._M_ptr = (pointer)local_c8;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar17->args,(unsigned_long *)&local_e8);
        bVar4 = true;
        src_00 = extraout_RDX_18;
      }
    }
    iVar10 = SmallVectorBase<slang::ast::Expression_*>::copy
                       (local_88,(EVP_PKEY_CTX *)compilation_00,src_00);
    local_e8._M_ptr = (pointer)CONCAT44(extraout_var_03,iVar10);
    local_e8._M_extent._M_extent_value = extraout_RDX_19;
    local_a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_d0);
    pCVar18 = BumpAllocator::
              emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                        (&compilation_00->super_BumpAllocator,pTVar13,
                         (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         &local_e8,&local_a0);
    if (bVar4) {
      pCVar18 = (ConcatenationExpression *)
                Expression::badExpr(compilation_00,&pCVar18->super_Expression);
    }
    if (local_88[0].data_ == (pointer)local_88[0].firstElement) {
      return &pCVar18->super_Expression;
    }
  }
  operator_delete(local_88[0].data_);
  return &pCVar18->super_Expression;
}

Assistant:

Expression& ConcatenationExpression::fromSyntax(Compilation& compilation,
                                                const ConcatenationExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type* assignmentTarget) {
    // If we are in an assignment-like context with a target type that is an unpacked array,
    // this is an array concatenation (as opposed to a vector or string concatenation).
    if (assignmentTarget && assignmentTarget->isUnpackedArray()) {
        if (assignmentTarget->isAssociativeArray()) {
            context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
            return badExpr(compilation, nullptr);
        }

        bool bad = false;
        bool anyDynamic = false;
        size_t totalElems = 0;
        const Type& type = *assignmentTarget;
        const Type& elemType = *type.getArrayElementType();
        const bool isVirtualIface = elemType.isVirtualInterface();
        SmallVector<Expression*> buffer;

        for (auto argSyntax : syntax.expressions) {
            Expression* arg = nullptr;
            if (isVirtualIface) {
                arg = tryBindInterfaceRef(context, *argSyntax,
                                          /* isInterfacePort */ false);
            }

            if (!arg)
                arg = &create(compilation, *argSyntax, context);

            if (arg->bad()) {
                bad = true;
                continue;
            }

            if (arg->isImplicitlyAssignableTo(compilation, elemType)) {
                buffer.push_back(&convertAssignment(context, elemType, *arg, arg->sourceRange));
                totalElems++;
                continue;
            }

            // The argument can be an unpacked array as long as its element type is
            // assignment compatible with the target.
            auto& argType = *arg->type;
            if (argType.isUnpackedArray() &&
                elemType.isAssignmentCompatible(*argType.getArrayElementType())) {
                // If this is a dynamic array we can't check element counts statically.
                // Otherwise we should count each fixed element in the total.
                if (argType.hasFixedRange())
                    totalElems += argType.getFixedRange().width();
                else
                    anyDynamic = true;

                selfDetermined(context, arg);
                buffer.push_back(arg);
                continue;
            }

            // Otherwise this is an error.
            bad = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << argType;
            selfDetermined(context, arg);
            buffer.push_back(arg);
        }

        // If we have a fixed size source and target, check that they match in size.
        if (!bad && !anyDynamic && type.hasFixedRange() &&
            type.getFixedRange().width() != totalElems) {
            context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
                << type << type.getFixedRange().width() << totalElems;
            bad = true;
        }

        auto result = compilation.emplace<ConcatenationExpression>(type, buffer.ccopy(compilation),
                                                                   syntax.sourceRange());
        if (bad)
            return badExpr(compilation, result);

        return *result;
    }

    bool errored = false;
    bool unsizedWarned = false;
    bool anyStrings = false;
    bitmask<IntegralFlags> flags;
    bitwidth_t totalWidth = 0;
    SmallVector<Expression*> buffer;

    for (auto argSyntax : syntax.expressions) {
        // Replications inside of concatenations have a special feature that allows them to have
        // a width of zero. Check now if we're going to be creating a replication and if so set
        // an additional flag so that it knows it's ok to have that zero count.
        Expression* arg;
        if (argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            arg = &create(compilation, *argSyntax, context, ASTFlags::InsideConcatenation);
        else
            arg = &create(compilation, *argSyntax, context);
        buffer.push_back(arg);

        if (arg->bad()) {
            errored = true;
            break;
        }

        const Type& type = *arg->type;
        if (type.isVoid() && argSyntax->kind == SyntaxKind::MultipleConcatenationExpression)
            continue;

        if (type.isString()) {
            anyStrings = true;
            continue;
        }

        if (!type.isIntegral()) {
            errored = true;
            context.addDiag(diag::BadConcatExpression, arg->sourceRange) << type;
            break;
        }

        if (arg->isUnsizedInteger() && !unsizedWarned) {
            context.addDiag(diag::UnsizedInConcat, arg->sourceRange) << type.getBitWidth();
            unsizedWarned = true;
        }

        // Can't overflow because 2*maxWidth is still less than 2^32-1.
        totalWidth += type.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax.sourceRange())) {
            errored = true;
            break;
        }

        if (type.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (!errored) {
        for (size_t i = 0; i < buffer.size(); i++) {
            if (!anyStrings) {
                selfDetermined(context, buffer[i]);
            }
            else {
                Expression* expr = buffer[i];
                if (expr->type->isString()) {
                    selfDetermined(context, expr);
                }
                else if (expr->isImplicitString()) {
                    expr = &ConversionExpression::makeImplicit(context, compilation.getStringType(),
                                                               ConversionKind::Implicit, *expr,
                                                               nullptr, {});
                }
                else {
                    errored = true;
                    context.addDiag(diag::ConcatWithStringInt, expr->sourceRange);
                    break;
                }
                buffer[i] = expr;
            }
        }

        if (!anyStrings && totalWidth == 0) {
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
            errored = true;
        }
    }

    if (errored) {
        return badExpr(compilation,
                       compilation.emplace<ConcatenationExpression>(compilation.getErrorType(),
                                                                    std::span<const Expression*>(),
                                                                    syntax.sourceRange()));
    }

    const Type* type;
    if (anyStrings)
        type = &compilation.getStringType();
    else
        type = &compilation.getType(totalWidth, flags);

    return *compilation.emplace<ConcatenationExpression>(*type, buffer.ccopy(compilation),
                                                         syntax.sourceRange());
}